

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# porting.c
# Opt level: O0

int uni_thread_new(char *name,_func_void_ptr_void_ptr *fn,void *arg,int stack_size)

{
  int iVar1;
  undefined1 local_70 [8];
  pthread_attr_t attr;
  pthread_t pid;
  void *pvStack_28;
  int stack_size_local;
  void *arg_local;
  _func_void_ptr_void_ptr *fn_local;
  char *name_local;
  
  pid._4_4_ = stack_size;
  pvStack_28 = arg;
  arg_local = fn;
  fn_local = (_func_void_ptr_void_ptr *)name;
  pthread_attr_init((pthread_attr_t *)local_70);
  pthread_attr_setstacksize((pthread_attr_t *)local_70,(long)pid._4_4_);
  iVar1 = pthread_create((pthread_t *)(attr.__size + 0x30),(pthread_attr_t *)local_70,
                         (__start_routine *)arg_local,pvStack_28);
  if (iVar1 == 0) {
    pthread_detach(attr._48_8_);
    pthread_attr_destroy((pthread_attr_t *)local_70);
    name_local._4_4_ = 0;
  }
  else {
    pthread_attr_destroy((pthread_attr_t *)local_70);
    name_local._4_4_ = -3;
  }
  return name_local._4_4_;
}

Assistant:

int uni_thread_new(const char *name, void* (*fn)(void *), void *arg, int stack_size) {
    pthread_t pid;
    pthread_attr_t attr;
    pthread_attr_init(&attr);
    pthread_attr_setstacksize(&attr, stack_size);
    if (0 != pthread_create(&pid, &attr, fn, arg)) {
        pthread_attr_destroy(&attr);
        return -CREATE_TASK_FAIL;
    }

    pthread_detach(pid);
    pthread_attr_destroy(&attr);
    return OK;
}